

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O3

void __thiscall
AddressFactory_GetAddressByLockingScript_Test::TestBody
          (AddressFactory_GetAddressByLockingScript_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Script script;
  AddressFactory factory;
  Address address;
  string local_3a8;
  AssertHelper local_388;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  undefined1 local_378 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  uchar local_358 [16];
  pointer local_348;
  pointer local_330;
  pointer local_318;
  TapBranch local_300;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_288;
  Script local_270;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  Script local_200;
  AddressFactory local_1c8;
  Address local_1a0;
  
  cfd::AddressFactory::AddressFactory(&local_1c8);
  cfd::core::Script::Script(&local_200);
  cfd::core::Address::Address(&local_1a0);
  paVar1 = &local_3a8.field_2;
  local_3a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac","");
  cfd::core::Script::Script((Script *)local_378,&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_378,&local_1c8,&local_200);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch(&local_300);
      if (local_318 != (pointer)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (pointer)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (pointer)0x0) {
        operator_delete(local_348);
      }
      if ((uchar *)local_368._M_allocated_capacity != local_358) {
        operator_delete((void *)local_368._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x219,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8._M_dataplus._M_p = (pointer)0x0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3a8._M_dataplus._M_p = pcVar3;
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3a8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3a8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_378,(ByteData *)&local_3a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "49a011f97ba520dab063f309bad59daeb30de101");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p._0_4_ = local_1a0.addr_type_;
  local_388.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if ((long *)local_3a8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_378,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",(char *)CONCAT71(local_378._1_7_,local_378[0])
             ,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if ((char)local_3a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_378);
    if ((pointer)local_3a8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"76a91449a011f97ba520dab063f309bad59daeb30de10188ac","");
  cfd::core::Script::Script((Script *)local_378,&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_378,&local_1c8,&local_200);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch(&local_300);
      if (local_318 != (pointer)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (pointer)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (pointer)0x0) {
        operator_delete(local_348);
      }
      if ((uchar *)local_368._M_allocated_capacity != local_358) {
        operator_delete((void *)local_368._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21f,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8._M_dataplus._M_p = (pointer)0x0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3a8._M_dataplus._M_p = pcVar3;
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3a8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3a8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_378,(ByteData *)&local_3a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "49a011f97ba520dab063f309bad59daeb30de101");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x220,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p._0_4_ = local_1a0.addr_type_;
  local_388.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x221,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if ((long *)local_3a8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_378,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",(char *)CONCAT71(local_378._1_7_,local_378[0])
             ,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if ((char)local_3a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_378);
    if ((pointer)local_3a8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x222,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487","");
  cfd::core::Script::Script((Script *)local_378,&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_378,&local_1c8,&local_200);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch(&local_300);
      if (local_318 != (pointer)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (pointer)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (pointer)0x0) {
        operator_delete(local_348);
      }
      if ((uchar *)local_368._M_allocated_capacity != local_358) {
        operator_delete((void *)local_368._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x225,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8._M_dataplus._M_p = (pointer)0x0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3a8._M_dataplus._M_p = pcVar3;
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3a8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3a8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_378,(ByteData *)&local_3a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x226,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p._0_4_ = local_1a0.addr_type_;
  local_388.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kP2shAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x227,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if ((long *)local_3a8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_378,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw\"",(char *)CONCAT71(local_378._1_7_,local_378[0])
             ,"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if ((char)local_3a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_378);
    if ((pointer)local_3a8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x228,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c","");
  cfd::core::Script::Script((Script *)local_378,&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_378,&local_1c8,&local_200);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch(&local_300);
      if (local_318 != (pointer)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (pointer)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (pointer)0x0) {
        operator_delete(local_348);
      }
      if ((uchar *)local_368._M_allocated_capacity != local_358) {
        operator_delete((void *)local_368._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22b,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8._M_dataplus._M_p = (pointer)0x0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3a8._M_dataplus._M_p = pcVar3;
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3a8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3a8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_378,(ByteData *)&local_3a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p._0_4_ = local_1a0.addr_type_;
  local_388.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kP2wpkhAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if ((long *)local_3a8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_378,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if ((char)local_3a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_378);
    if ((pointer)local_3a8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437","");
  cfd::core::Script::Script((Script *)local_378,&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_378,&local_1c8,&local_200);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch(&local_300);
      if (local_318 != (pointer)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (pointer)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (pointer)0x0) {
        operator_delete(local_348);
      }
      if ((uchar *)local_368._M_allocated_capacity != local_358) {
        operator_delete((void *)local_368._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x231,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8._M_dataplus._M_p = (pointer)0x0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3a8._M_dataplus._M_p = pcVar3;
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3a8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3a8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_378,(ByteData *)&local_3a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x232,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p._0_4_ = local_1a0.addr_type_;
  local_388.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kP2wshAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x233,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if ((long *)local_3a8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_378,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if ((char)local_3a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_378);
    if ((pointer)local_3a8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x234,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb","");
  cfd::core::Script::Script((Script *)local_378,&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_378,&local_1c8,&local_200);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch(&local_300);
      if (local_318 != (pointer)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (pointer)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (pointer)0x0) {
        operator_delete(local_348);
      }
      if ((uchar *)local_368._M_allocated_capacity != local_358) {
        operator_delete((void *)local_368._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x237,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8._M_dataplus._M_p = (pointer)0x0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3a8._M_dataplus._M_p = pcVar3;
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3a8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3a8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_378,(ByteData *)&local_3a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x238,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p._0_4_ = local_1a0.addr_type_;
  local_388.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kTaprootAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x239,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if ((long *)local_3a8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_378,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if ((char)local_3a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_378);
    if ((pointer)local_3a8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799","");
  cfd::core::Script::Script((Script *)local_378,&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Address *)local_378,&local_1c8,&local_200);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch(&local_300);
      if (local_318 != (pointer)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (pointer)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (pointer)0x0) {
        operator_delete(local_348);
      }
      if ((uchar *)local_368._M_allocated_capacity != local_358) {
        operator_delete((void *)local_368._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23d,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8._M_dataplus._M_p = (pointer)0x0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar3 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar3 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_3a8.field_2._M_allocated_capacity = (size_type)(pcVar3 + uVar4);
  local_3a8._M_dataplus._M_p = pcVar3;
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3a8._M_string_length = (size_type)pcVar3;
    memmove(pcVar3,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_3a8._M_string_length = (size_type)(pcVar3 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_378,(ByteData *)&local_3a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_380.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._M_dataplus._M_p._0_4_ = local_1a0.addr_type_;
  local_388.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kTaprootAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_370.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_370.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if ((long *)local_3a8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_3a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_378,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_378._1_7_,local_378[0]) != &local_368) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if ((char)local_3a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_378);
    if ((pointer)local_3a8._M_string_length == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_3a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x240,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1a0.format_data_);
  cfd::core::Script::~Script(&local_1a0.redeem_script_);
  local_1a0.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_1a0.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_1a0.script_tree_.super_TapBranch);
  if (local_1a0.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.address_._M_dataplus._M_p != &local_1a0.address_.field_2) {
    operator_delete(local_1a0.address_._M_dataplus._M_p);
  }
  cfd::core::Script::~Script(&local_200);
  local_1c8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_1c8.prefix_list_);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByLockingScript)
{
  AddressFactory factory;
  Script script;
  Address address;

  script = Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("76a91449a011f97ba520dab063f309bad59daeb30de10188ac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2shAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");

  script = Script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");

  script = Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wshAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  
  script = Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  
  script = Script("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
}